

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O1

void __thiscall
st_tree::detail::
node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
::_erase(node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
         *this,iterator *j)

{
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int> **__src
  ;
  pointer *pppnVar1;
  node_type *n;
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
  **__dest;
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
  **ppnVar2;
  
  n = *(j->_base)._M_current;
  _prune(this,n);
  __dest = (j->_base)._M_current;
  __src = __dest + 1;
  ppnVar2 = (this->_children).
            super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__src != ppnVar2) {
    memmove(__dest,__src,(long)ppnVar2 - (long)__src);
  }
  pppnVar1 = &(this->_children).
              super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  *pppnVar1 = *pppnVar1 + -1;
  tree(this);
  (**(n->
     super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
     )._vptr_node_base)(n);
  operator_delete(n,0x68);
  return;
}

Assistant:

void _erase(const iterator& j) {
        node_type* n = &*j;
        _prune(n);
        _children.erase(j.base());
        this->tree()._delete_node(n);
    }